

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O3

int __thiscall H264StreamReader::getNalHrdLen(H264StreamReader *this,uint8_t *nal)

{
  int iVar1;
  long lVar2;
  
  lVar2 = (long)(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd - (long)nal;
  if ((((lVar2 < 3) || (*nal != '\0')) || (nal[1] != '\0')) ||
     ((iVar1 = 3, nal[2] != '\x01' && ((lVar2 == 3 || (iVar1 = 4, nal[3] != '\x01')))))) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int H264StreamReader::getNalHrdLen(const uint8_t *nal) const
{
    if (m_bufEnd - nal >= 3)
    {
        if (nal[0] == 0 && nal[1] == 0)
        {
            if (nal[2] == 1)
                return 3;
            if (m_bufEnd - nal >= 4 && nal[3] == 1)
                return 4;
        }
    }
    return 0;
}